

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

void Abc_NtkCollectHie_rec(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  uint uVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *__ptr;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  if (-1 < pNtk->iStep) {
    return;
  }
  __ptr = Abc_NtkDfsBoxes(pNtk);
  iVar5 = __ptr->nSize;
  if (0 < (long)iVar5) {
    ppvVar3 = __ptr->pArray;
    lVar4 = 0;
    do {
      uVar1 = *(uint *)((long)ppvVar3[lVar4] + 0x14);
      if (((uVar1 & 0xe) == 8 || (uVar1 & 0xf) == 10) &&
         (pNtk_00 = *(Abc_Ntk_t **)((long)ppvVar3[lVar4] + 0x38), pNtk_00 != pNtk)) {
        Abc_NtkCollectHie_rec(pNtk_00,vModels);
      }
      lVar4 = lVar4 + 1;
    } while (iVar5 != lVar4);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  uVar1 = vModels->nSize;
  pNtk->iStep = uVar1;
  uVar2 = vModels->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vModels->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vModels->pArray,0x80);
      }
      vModels->pArray = ppvVar3;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar2 * 2;
      if (iVar5 <= (int)uVar2) goto LAB_0085cf08;
      if (vModels->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(vModels->pArray,(ulong)uVar2 << 4);
      }
      vModels->pArray = ppvVar3;
    }
    vModels->nCap = iVar5;
  }
LAB_0085cf08:
  iVar5 = vModels->nSize;
  vModels->nSize = iVar5 + 1;
  vModels->pArray[iVar5] = pNtk;
  return;
}

Assistant:

void Abc_NtkCollectHie_rec( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{
    Vec_Ptr_t * vOrder;
    Abc_Obj_t * pObj;
    int i;
    if ( pNtk->iStep >= 0 )
        return;
    vOrder = Abc_NtkDfsBoxes( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrder, pObj, i )
        if ( Abc_ObjIsBox(pObj) && (Abc_Ntk_t *)pObj->pData != pNtk )
            Abc_NtkCollectHie_rec( (Abc_Ntk_t *)pObj->pData, vModels );
    Vec_PtrFree( vOrder );
    pNtk->iStep = Vec_PtrSize(vModels);
    Vec_PtrPush( vModels, pNtk );
}